

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader15.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::MeshLoader15::begin__input____input_local_offset_type
          (MeshLoader15 *this,input____input_local_offset_type__AttributeData *attributeData)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint local_28 [2];
  uint64 local_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  uint64 local_8;
  
  local_18 = *(undefined4 *)&attributeData->semantic;
  uStack_14 = *(undefined4 *)((long)&attributeData->semantic + 4);
  uStack_10 = *(undefined4 *)&attributeData->source;
  uStack_c = *(undefined4 *)((long)&attributeData->source + 4);
  uVar2 = 2;
  bVar3 = (attributeData->present_attributes & 1) != 0;
  if (bVar3) {
    local_20 = attributeData->offset;
    uVar2 = 3;
  }
  local_28[0] = (uint)bVar3;
  if ((attributeData->present_attributes & 2) != 0) {
    local_8 = attributeData->set;
    local_28[0] = uVar2;
  }
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x21])(this->mLoader,local_28);
  return SUB41(iVar1,0);
}

Assistant:

bool MeshLoader15::begin__input____input_local_offset_type( const COLLADASaxFWL15::input____input_local_offset_type__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__input____input_local_offset_type(attributeData));
COLLADASaxFWL::input____InputLocalOffset__AttributeData attrData;
attrData.present_attributes = 0;
attrData.semantic = attributeData.semantic;
attrData.source = attributeData.source;
if ( (attributeData.present_attributes & COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT) == COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT ) {
    attrData.offset = attributeData.offset;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_SET_PRESENT) == COLLADASaxFWL15::input____input_local_offset_type__AttributeData::ATTRIBUTE_SET_PRESENT ) {
    attrData.set = attributeData.set;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT;
}
return mLoader->begin__input____InputLocalOffset(attrData);
}